

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight.cpp
# Opt level: O1

ostream * operator<<(ostream *out,User *usr)

{
  ostream *poVar1;
  key k;
  key k_00;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"My name is ",0xb);
  User::get_item_abi_cxx11_(&local_38,(User *)(ulong)usr->m_first_name,k);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  User::get_item_abi_cxx11_(&local_58,(User *)(ulong)usr->m_last_name,k_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const User& usr)
	{
		return out << "My name is " << usr.first_name() << " " << usr.last_name();
	}